

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

PMNDX_PACKAGE __thiscall
TRootHandler_MNDX::FindMndxPackage(TRootHandler_MNDX *this,char *szFileName)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  PMNDX_PACKAGE p_Var4;
  undefined8 *puVar5;
  PMNDX_PACKAGE pPackage;
  size_t i;
  size_t nLength;
  size_t nMaxLength;
  PMNDX_PACKAGE pMatching;
  char *szFileName_local;
  TRootHandler_MNDX *this_local;
  
  nMaxLength = 0;
  nLength = 0;
  sVar2 = strlen(szFileName);
  sVar3 = CASC_ARRAY::ItemCount(&this->Packages);
  if (sVar3 == 0) {
    __assert_fail("Packages.ItemCount() != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_MNDX.cpp"
                  ,0xa82,"PMNDX_PACKAGE TRootHandler_MNDX::FindMndxPackage(const char *)");
  }
  for (pPackage = (PMNDX_PACKAGE)0x0; p_Var4 = (PMNDX_PACKAGE)CASC_ARRAY::ItemCount(&this->Packages)
      , pPackage < p_Var4; pPackage = (PMNDX_PACKAGE)((long)&pPackage->szFileName + 1)) {
    puVar5 = (undefined8 *)CASC_ARRAY::ItemAt(&this->Packages,(size_t)pPackage);
    if ((((ulong)puVar5[1] < sVar2) && (nLength < (ulong)puVar5[1])) &&
       (iVar1 = strncmp(szFileName,(char *)*puVar5,puVar5[1]), iVar1 == 0)) {
      nLength = puVar5[1];
      nMaxLength = (size_t)puVar5;
    }
  }
  return (PMNDX_PACKAGE)nMaxLength;
}

Assistant:

PMNDX_PACKAGE FindMndxPackage(const char * szFileName)
    {
        PMNDX_PACKAGE pMatching = NULL;
        size_t nMaxLength = 0;
        size_t nLength = strlen(szFileName);

        // Packages must be loaded
        assert(Packages.ItemCount() != 0);

        //FILE * fp = fopen("E:\\packages.txt", "wt");
        //for(size_t i = 0; i < hs->pPackages->NameEntries; i++, pPackage++)
        //{
        //    if(pPackage->szFileName != NULL)
        //        fprintf(fp, "%s\n", pPackage->szFileName);
        //}
        //fclose(fp);

        // Find the longest matching name
        for(size_t i = 0; i < Packages.ItemCount(); i++)
        {
            PMNDX_PACKAGE pPackage = (PMNDX_PACKAGE)Packages.ItemAt(i);

            if(pPackage->nLength < nLength && pPackage->nLength > nMaxLength)
            {
                // Compare the package name
                if(!strncmp(szFileName, pPackage->szFileName, pPackage->nLength))
                {
                    nMaxLength = pPackage->nLength;
                    pMatching = pPackage;
                }
            }
        }

        // Give the package pointer or NULL if not found
        return pMatching;
    }